

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_compute.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  undefined1 local_1ed0 [8];
  Data data;
  Init init;
  
  Init::Init((Init *)&data.descriptor_set_layout);
  iVar1 = device_initialization((Init *)&data.descriptor_set_layout);
  if (iVar1 == 0) {
    iVar1 = get_queues((Init *)&data.descriptor_set_layout,(Data *)local_1ed0);
    if (iVar1 == 0) {
      create_descriptor((Init *)&data.descriptor_set_layout,(Data *)local_1ed0);
      create_compute_pipeline((Init *)&data.descriptor_set_layout,(Data *)local_1ed0);
      create_command_pool((Init *)&data.descriptor_set_layout,(Data *)local_1ed0);
      create_buffers((Init *)&data.descriptor_set_layout,(Data *)local_1ed0);
      create_and_submit_work((Init *)&data.descriptor_set_layout,(Data *)local_1ed0);
      cleanup((EVP_PKEY_CTX *)&data.descriptor_set_layout);
      init.disp._4996_4_ = 0;
    }
    else {
      init.disp._4996_4_ = 0xffffffff;
    }
  }
  else {
    init.disp._4996_4_ = 0xffffffff;
  }
  Init::~Init((Init *)&data.descriptor_set_layout);
  return init.disp._4996_4_;
}

Assistant:

int main() {
    Init init;
    Data data;

    if (0 != device_initialization(init)) return -1;
    if (0 != get_queues(init, data)) return -1;
    // We are not error checking here, not good practice, but this is just an example program!
    create_descriptor(init, data);
    create_compute_pipeline(init, data);
    create_command_pool(init, data);
    create_buffers(init, data);
    create_and_submit_work(init, data);
    cleanup(init, data);
    return 0;
}